

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

void __thiscall sf::Window::initialize(Window *this)

{
  Time this_00;
  Window *in_RDI;
  Window *unaff_retaddr;
  Clock *in_stack_00000008;
  Window *in_stack_fffffffffffffff0;
  
  setVerticalSyncEnabled(in_stack_fffffffffffffff0,SUB81((ulong)in_RDI >> 0x38,0));
  setFramerateLimit(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  this_00 = Clock::restart(in_stack_00000008);
  setActive(in_RDI,SUB81((ulong)this_00.m_microseconds >> 0x38,0));
  WindowBase::initialize((WindowBase *)this_00.m_microseconds);
  return;
}

Assistant:

void Window::initialize()
{
    // Setup default behaviors (to get a consistent behavior across different implementations)
    setVerticalSyncEnabled(false);
    setFramerateLimit(0);

    // Reset frame time
    m_clock.restart();

    // Activate the window
    setActive();

    WindowBase::initialize();
}